

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

void __thiscall
boost::runtime::basic_param::
basic_param<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const,boost::runtime::(anonymous_namespace)::enum_values_t,std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::output_format_const,boost::runtime::(anonymous_namespace)::default_value_t,boost::unit_test::output_format_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>>
          (basic_param *this,cstring *name,bool is_optional,bool is_repeatable,
          named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>
          *m)

{
  bool bVar1;
  basic_cstring<const_char> *this_00;
  byte in_CL;
  byte in_DL;
  basic_cstring<const_char> *in_RSI;
  undefined8 *in_RDI;
  named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
  *in_R8;
  undefined1 in_stack_fffffffffffffe0f;
  readwrite_property<bool> *in_stack_fffffffffffffe10;
  allocator<char> *in_stack_fffffffffffffe18;
  undefined8 *puVar2;
  char *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  byte bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  cstring *value_separator;
  named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
  *pnVar4;
  cstring *prefix;
  basic_param *this_01;
  basic_cstring<const_char> local_118;
  basic_cstring<const_char> local_108;
  undefined1 local_f8 [40];
  cstring local_d0 [2];
  string local_a8 [40];
  string local_80 [40];
  string local_58 [55];
  allocator<char> local_21;
  named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
  *local_20;
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  *in_RDI = &PTR__basic_param_00302c70;
  local_20 = in_R8;
  unit_test::basic_cstring<const_char>::begin(in_RSI);
  unit_test::basic_cstring<const_char>::end(in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>
            (in_stack_fffffffffffffe30,
             (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::allocator<char>::~allocator(&local_21);
  pnVar4 = local_20;
  std::__cxx11::string::string(local_58);
  nfp::
  opt_get<std::__cxx11::string,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const,boost::runtime::(anonymous_namespace)::enum_values_t,std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::output_format_const,boost::runtime::(anonymous_namespace)::default_value_t,boost::unit_test::output_format_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>,boost::nfp::typed_keyword<boost::unit_test::basic_cstring<char_const>,boost::runtime::(anonymous_namespace)::description_t,false>>
            (in_RDI + 5,pnVar4,local_58);
  std::__cxx11::string::~string(local_58);
  pnVar4 = local_20;
  std::__cxx11::string::string(local_80);
  nfp::
  opt_get<std::__cxx11::string,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const,boost::runtime::(anonymous_namespace)::enum_values_t,std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::output_format_const,boost::runtime::(anonymous_namespace)::default_value_t,boost::unit_test::output_format_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>,boost::nfp::typed_keyword<boost::unit_test::basic_cstring<char_const>,boost::runtime::(anonymous_namespace)::help_t,false>>
            (in_RDI + 9,pnVar4,local_80);
  std::__cxx11::string::~string(local_80);
  pnVar4 = local_20;
  this_01 = (basic_param *)(in_RDI + 0xd);
  std::__cxx11::string::string(local_a8);
  nfp::
  opt_get<std::__cxx11::string,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const,boost::runtime::(anonymous_namespace)::enum_values_t,std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::output_format_const,boost::runtime::(anonymous_namespace)::default_value_t,boost::unit_test::output_format_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>,boost::nfp::typed_keyword<boost::unit_test::basic_cstring<char_const>,boost::runtime::(anonymous_namespace)::env_var_t,false>>
            (this_01,pnVar4,local_a8);
  std::__cxx11::string::~string(local_a8);
  value_separator = (cstring *)(in_RDI + 0x11);
  prefix = local_d0;
  pnVar4 = local_20;
  std::__cxx11::string::string((string *)prefix);
  nfp::
  opt_get<std::__cxx11::string,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const,boost::runtime::(anonymous_namespace)::enum_values_t,std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::output_format_const,boost::runtime::(anonymous_namespace)::default_value_t,boost::unit_test::output_format_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>,boost::nfp::typed_keyword<boost::unit_test::basic_cstring<char_const>,boost::runtime::(anonymous_namespace)::value_hint_t,false>>
            (value_separator,pnVar4,prefix);
  std::__cxx11::string::~string((string *)local_d0);
  *(byte *)(in_RDI + 0x15) = local_11 & 1;
  *(byte *)((long)in_RDI + 0xa9) = local_12 & 1;
  nfp::
  named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
  ::has<boost::runtime::(anonymous_namespace)::optional_value_t>
            ((named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
              *)local_20);
  unit_test::readwrite_property<bool>::readwrite_property
            (in_stack_fffffffffffffe10,(write_param_t)in_stack_fffffffffffffe0f);
  this_00 = (basic_cstring<const_char> *)((long)in_RDI + 0xab);
  bVar1 = nfp::
          named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
          ::has(local_20);
  bVar3 = 1;
  if (!bVar1) {
    bVar3 = local_12;
  }
  unit_test::readwrite_property<bool>::readwrite_property
            (in_stack_fffffffffffffe10,(write_param_t)in_stack_fffffffffffffe0f);
  puVar2 = in_RDI + 0x16;
  function<void_(boost::unit_test::basic_cstring<const_char>)>::function
            ((function<void_(boost::unit_test::basic_cstring<const_char>)> *)0x22dc64);
  nfp::
  opt_get<boost::function<void(boost::unit_test::basic_cstring<char_const>)>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const,boost::runtime::(anonymous_namespace)::enum_values_t,std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::output_format_const,boost::runtime::(anonymous_namespace)::default_value_t,boost::unit_test::output_format_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>,boost::nfp::keyword<boost::runtime::(anonymous_namespace)::callback_t,false>>
            (puVar2,local_20,local_f8);
  function<void_(boost::unit_test::basic_cstring<const_char>)>::~function
            ((function<void_(boost::unit_test::basic_cstring<const_char>)> *)0x22dc8c);
  std::vector<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>::
  vector((vector<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
          *)0x22dca5);
  unit_test::basic_cstring<const_char>::basic_cstring
            (&local_108,(basic_cstring<const_char> *)help_prefix);
  unit_test::basic_cstring<const_char>::basic_cstring(&local_118,in_RSI);
  unit_test::basic_cstring<const_char>::basic_cstring
            (this_00,(pointer)CONCAT17(bVar3,in_stack_fffffffffffffe28));
  add_cla_id(this_01,prefix,(cstring *)pnVar4,value_separator);
  return;
}

Assistant:

basic_param( cstring name, bool is_optional, bool is_repeatable, Modifiers const& m )
    : p_name( name.begin(), name.end() )
    , p_description( nfp::opt_get( m, description, std::string() ) )
    , p_help( nfp::opt_get( m, runtime::help, std::string() ) )
    , p_env_var( nfp::opt_get( m, env_var, std::string() ) )
    , p_value_hint( nfp::opt_get( m, value_hint, std::string() ) )
    , p_optional( is_optional )
    , p_repeatable( is_repeatable )
    , p_has_optional_value( m.has( optional_value ) )
    , p_has_default_value( m.has( default_value ) || is_repeatable )
    , p_callback( nfp::opt_get( m, callback, callback_type() ) )
    {
        add_cla_id( help_prefix, name, ":" );
    }